

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

optional<pbrt::ShapeSample> * __thiscall
pbrt::Cylinder::Sample
          (optional<pbrt::ShapeSample> *__return_storage_ptr__,Cylinder *this,
          ShapeSampleContext *ctx,Point2f u)

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  anon_struct_8_0_00000001_for___align aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  optional<pbrt::ShapeSample> ss;
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_88;
  bool local_30;
  undefined1 local_28 [16];
  
  Sample((optional<pbrt::ShapeSample> *)&local_88.__align,this,u);
  if (local_30 == false) {
    LogFatal<char_const(&)[4]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
               ,0xea,"Check failed: %s",(char (*) [4])0x2c8dc3c);
  }
  local_88._24_4_ = ctx->time;
  auVar10._4_4_ = local_88._12_4_;
  auVar10._0_4_ = local_88._8_4_;
  auVar10._8_4_ = local_88._16_4_;
  auVar10._12_4_ = local_88._20_4_;
  fVar4 = ((float)local_88._0_4_ + (float)local_88._4_4_) * 0.5 -
          ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low +
          (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high)
          * 0.5;
  auVar3._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                 .low;
  auVar3._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y
                 .high;
  auVar3._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z
                 .low;
  auVar3._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high;
  auVar10 = vinsertps_avx(auVar10,ZEXT416((uint)local_88._20_4_),0x10);
  auVar13._0_4_ = ((float)local_88._12_4_ + auVar10._0_4_) * 0.5;
  auVar13._4_4_ = ((float)local_88._16_4_ + auVar10._4_4_) * 0.5;
  auVar13._8_4_ = (auVar10._8_4_ + 0.0) * 0.5;
  auVar13._12_4_ = (auVar10._12_4_ + 0.0) * 0.5;
  uVar1 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
  ;
  auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),
                         0x10);
  auVar11._0_4_ = ((float)uVar1 + auVar3._0_4_) * 0.5;
  auVar11._4_4_ = ((float)((ulong)uVar1 >> 0x20) + auVar3._4_4_) * 0.5;
  auVar11._8_4_ = (auVar3._8_4_ + 0.0) * 0.5;
  auVar11._12_4_ = (auVar3._12_4_ + 0.0) * 0.5;
  auVar10 = vsubps_avx(auVar13,auVar11);
  auVar14._0_4_ = auVar10._0_4_ * auVar10._0_4_;
  auVar14._4_4_ = auVar10._4_4_ * auVar10._4_4_;
  auVar14._8_4_ = auVar10._8_4_ * auVar10._8_4_;
  auVar14._12_4_ = auVar10._12_4_ * auVar10._12_4_;
  auVar3 = vmovshdup_avx(auVar14);
  fVar12 = fVar4 * fVar4 + auVar14._0_4_ + auVar3._0_4_;
  if ((fVar12 != 0.0) || (NAN(fVar12))) {
    if (fVar12 < 0.0) {
      local_28 = auVar10;
      fVar12 = sqrtf(fVar12);
      auVar10 = local_28;
    }
    else {
      auVar3 = vsqrtss_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
      fVar12 = auVar3._0_4_;
    }
    if (local_30 == false) {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2c8dc3c);
    }
    auVar18._0_8_ = auVar10._0_8_ ^ 0x8000000080000000;
    auVar18._8_4_ = auVar10._8_4_ ^ 0x80000000;
    auVar18._12_4_ = auVar10._12_4_ ^ 0x80000000;
    auVar20._4_4_ = fVar12;
    auVar20._0_4_ = fVar12;
    auVar20._8_4_ = fVar12;
    auVar20._12_4_ = fVar12;
    auVar3 = vdivps_avx(auVar18,auVar20);
    auVar21._4_4_ = local_88._48_4_;
    auVar21._0_4_ = local_88._44_4_;
    auVar21._8_8_ = 0;
    auVar22._0_4_ = auVar3._0_4_ * (float)local_88._44_4_;
    auVar22._4_4_ = auVar3._4_4_ * (float)local_88._48_4_;
    auVar22._8_4_ = auVar3._8_4_ * 0.0;
    auVar22._12_4_ = auVar3._12_4_ * 0.0;
    uVar6 = CONCAT44(auVar22._4_4_,auVar22._0_4_);
    auVar15._0_8_ = uVar6 ^ 0x8000000080000000;
    auVar15._8_4_ = -auVar22._8_4_;
    auVar15._12_4_ = -auVar22._12_4_;
    auVar10 = vpermi2ps_avx512vl(_DAT_003d1540,auVar22,auVar15);
    auVar3 = vfmadd231ps_fma(auVar10,auVar21,auVar3);
    auVar3 = vhaddps_avx(auVar3,auVar3);
    auVar3 = vfnmadd231ss_fma(auVar3,ZEXT416((uint)(fVar4 / fVar12)),ZEXT416((uint)local_88._40_4_))
    ;
    auVar5._8_4_ = 0x7fffffff;
    auVar5._0_8_ = 0x7fffffff7fffffff;
    auVar5._12_4_ = 0x7fffffff;
    auVar11 = vandps_avx512vl(auVar3,auVar5);
    auVar2._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.low;
    auVar2._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .x.high;
    auVar2._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>
                   .y.low;
    auVar2._12_4_ =
         (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
    auVar8._4_4_ = local_88._4_4_;
    auVar8._0_4_ = local_88._0_4_;
    auVar8._8_4_ = local_88._8_4_;
    auVar8._12_4_ = local_88._12_4_;
    auVar9._4_4_ = local_88._8_4_;
    auVar9._0_4_ = local_88._4_4_;
    auVar9._8_4_ = local_88._12_4_;
    auVar9._12_4_ = local_88._16_4_;
    fVar12 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
              low + (ctx->pi).super_Point3<pbrt::Interval>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5 -
             ((float)local_88._8_4_ + (float)local_88._12_4_) * 0.5;
    auVar3 = vinsertps_avx(auVar2,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low),
                           0x10);
    auVar10 = vinsertps_avx(*(undefined1 (*) [16])
                             &(ctx->pi).super_Point3<pbrt::Interval>.
                              super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                            ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                          super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10);
    auVar16._0_4_ = (auVar3._0_4_ + auVar10._0_4_) * 0.5;
    auVar16._4_4_ = (auVar3._4_4_ + auVar10._4_4_) * 0.5;
    auVar16._8_4_ = (auVar3._8_4_ + auVar10._8_4_) * 0.5;
    auVar16._12_4_ = (auVar3._12_4_ + auVar10._12_4_) * 0.5;
    auVar3 = vinsertps_avx(auVar8,ZEXT416((uint)local_88._16_4_),0x10);
    auVar10 = vinsertps_avx(auVar9,ZEXT416((uint)local_88._20_4_),0x10);
    auVar19._0_4_ = (auVar3._0_4_ + auVar10._0_4_) * 0.5;
    auVar19._4_4_ = (auVar3._4_4_ + auVar10._4_4_) * 0.5;
    auVar19._8_4_ = (auVar3._8_4_ + auVar10._8_4_) * 0.5;
    auVar19._12_4_ = (auVar3._12_4_ + auVar10._12_4_) * 0.5;
    auVar3 = vsubps_avx(auVar16,auVar19);
    auVar17._0_4_ = auVar3._0_4_ * auVar3._0_4_;
    auVar17._4_4_ = auVar3._4_4_ * auVar3._4_4_;
    auVar17._8_4_ = auVar3._8_4_ * auVar3._8_4_;
    auVar17._12_4_ = auVar3._12_4_ * auVar3._12_4_;
    auVar3 = vmovshdup_avx(auVar17);
    fVar12 = (float)local_88._80_4_ /
             (auVar11._0_4_ / (auVar17._0_4_ + fVar12 * fVar12 + auVar3._0_4_));
    if (ABS(fVar12) != INFINITY) {
      __return_storage_ptr__->set = local_30;
      aVar7._4_4_ = local_88._4_4_;
      aVar7._0_4_ = local_88._0_4_;
      (__return_storage_ptr__->optionalValue).__align = aVar7;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) =
           CONCAT44(local_88._12_4_,local_88._8_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
           CONCAT44(local_88._20_4_,local_88._16_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
           CONCAT44(local_88._28_4_,local_88._24_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = local_88._32_8_;
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
           CONCAT44(local_88._44_4_,local_88._40_4_);
      *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
           CONCAT44(local_88._52_4_,local_88._48_4_);
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = local_88._56_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = local_88._64_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
      *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = local_88._72_8_;
      *(float *)((long)&__return_storage_ptr__->optionalValue + 0x50) = fVar12;
      return __return_storage_ptr__;
    }
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
  *(undefined8 *)&__return_storage_ptr__->set = 0;
  (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  return __return_storage_ptr__;
}

Assistant:

PBRT_CPU_GPU
    pstd::optional<ShapeSample> Sample(const ShapeSampleContext &ctx, Point2f u) const {
        // Uniformly sample shape and compute incident direction _wi_
        pstd::optional<ShapeSample> ss = Sample(u);
        DCHECK(ss.has_value());
        ss->intr.time = ctx.time;
        Vector3f wi = ss->intr.p() - ctx.p();
        if (LengthSquared(wi) == 0)
            return {};
        wi = Normalize(wi);

        // Convert uniform area sample PDF in _ss_ to solid angle measure
        ss->pdf /= AbsDot(ss->intr.n, -wi) / DistanceSquared(ctx.p(), ss->intr.p());
        if (IsInf(ss->pdf))
            return {};

        return ss;
    }